

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

map<int,_njoy::ENDFtk::section::Type<34>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<34>_>_>_>
* __thiscall
njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::section::Type<34>>::
read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (map<int,_njoy::ENDFtk::section::Type<34>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<34>_>_>_>
           *__return_storage_ptr__,
          Base<njoy::ENDFtk::file::Type<34>,njoy::ENDFtk::section::Type<34>> *this,
          StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  bool bVar1;
  vector<njoy::ENDFtk::section::Type<34>,_std::allocator<njoy::ENDFtk::section::Type<34>_>_>
  sections;
  vector<njoy::ENDFtk::section::Type<34>,_std::allocator<njoy::ENDFtk::section::Type<34>_>_>
  local_88;
  undefined1 local_70 [64];
  
  local_88.
  super__Vector_base<njoy::ENDFtk::section::Type<34>,_std::allocator<njoy::ENDFtk::section::Type<34>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<njoy::ENDFtk::section::Type<34>,_std::allocator<njoy::ENDFtk::section::Type<34>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<njoy::ENDFtk::section::Type<34>,_std::allocator<njoy::ENDFtk::section::Type<34>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    bVar1 = StructureDivision::isFend((StructureDivision *)this);
    if (bVar1) break;
    Type<34>::readSection<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((Type<34> *)local_70,(Type<34> *)this,division,begin,end,lineNumber);
    std::vector<njoy::ENDFtk::section::Type<34>,std::allocator<njoy::ENDFtk::section::Type<34>>>::
    emplace_back<njoy::ENDFtk::section::Type<34>>
              ((vector<njoy::ENDFtk::section::Type<34>,std::allocator<njoy::ENDFtk::section::Type<34>>>
                *)&local_88,(Type<34> *)local_70);
    std::
    vector<njoy::ENDFtk::section::Type<34>::ReactionBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::ReactionBlock>_>
    ::~vector((vector<njoy::ENDFtk::section::Type<34>::ReactionBlock,_std::allocator<njoy::ENDFtk::section::Type<34>::ReactionBlock>_>
               *)(local_70 + 0x18));
    StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((StructureDivision *)local_70,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)division,begin,(long *)end);
    StructureDivision::operator=((StructureDivision *)this,(StructureDivision *)local_70);
  }
  Base<njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::section::Type<34>_>::verifyFEND
            ((StructureDivision *)this,(long)end->_M_current);
  Base<njoy::ENDFtk::file::Type<34>,_njoy::ENDFtk::section::Type<34>_>::fill
            (__return_storage_ptr__,&local_88);
  std::vector<njoy::ENDFtk::section::Type<34>,_std::allocator<njoy::ENDFtk::section::Type<34>_>_>::
  ~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static auto
read( StructureDivision& division,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber ) {

  std::vector< Section > sections;
  while ( not division.isFend() ) {

    sections.emplace_back( Derived::readSection( division, begin, end, lineNumber ) );
    division = StructureDivision( begin, end, lineNumber );
  }
  verifyFEND( division, lineNumber );
  return fill( std::move( sections ) );
}